

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O3

FT_Error ps_builder_add_point1(PS_Builder *builder,FT_Pos x,FT_Pos y)

{
  short sVar1;
  FT_GlyphLoader loader;
  FT_Outline *pFVar2;
  FT_Vector *pFVar3;
  char *pcVar4;
  FT_Error FVar5;
  FT_Outline *outline;
  
  loader = builder->loader;
  if ((loader->max_points <
       (int)(loader->base).outline.n_points + (int)(loader->current).outline.n_points + 1U) &&
     (FVar5 = FT_GlyphLoader_CheckPoints(loader,1,0), FVar5 != 0)) {
    return FVar5;
  }
  pFVar2 = builder->current;
  if (builder->load_points != '\0') {
    sVar1 = pFVar2->n_points;
    pFVar3 = pFVar2->points;
    pcVar4 = pFVar2->tags;
    pFVar3[sVar1].x = x >> 10;
    pFVar3[sVar1].y = y >> 10;
    pcVar4[sVar1] = '\x01';
  }
  pFVar2->n_points = pFVar2->n_points + 1;
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_builder_add_point1( PS_Builder*  builder,
                         FT_Pos       x,
                         FT_Pos       y )
  {
    FT_Error  error;


    error = ps_builder_check_points( builder, 1 );
    if ( !error )
      ps_builder_add_point( builder, x, y, 1 );

    return error;
  }